

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O3

void worker(void *arg)

{
  uv__queue *puVar1;
  uv__queue *puVar2;
  uv__queue *puVar3;
  uv__queue *puVar4;
  
  uv_sem_post((uv_sem_t *)arg);
  uv_mutex_lock(&mutex);
LAB_0010b6b5:
  while (puVar3 = wq.next, wq.next == &wq) {
LAB_0010b862:
    idle_threads = idle_threads + 1;
    uv_cond_wait(&cond,&mutex);
    idle_threads = idle_threads - 1;
  }
  if (wq.next == &run_slow_work_message) {
    if ((run_slow_work_message.next == &wq) && (nthreads + 1 >> 1 <= slow_io_work_running))
    goto LAB_0010b862;
    (run_slow_work_message.prev)->next = run_slow_work_message.next;
    (run_slow_work_message.next)->prev = run_slow_work_message.prev;
    puVar4 = slow_io_pending_wq.next;
    run_slow_work_message.next = &run_slow_work_message;
    run_slow_work_message.prev = &run_slow_work_message;
    if (nthreads + 1 >> 1 <= slow_io_work_running) {
      run_slow_work_message.next = &wq;
      run_slow_work_message.prev = wq.prev;
      (wq.prev)->next = &run_slow_work_message;
      wq.prev = &run_slow_work_message;
      goto LAB_0010b6b5;
    }
    if (slow_io_pending_wq.next == &slow_io_pending_wq) goto LAB_0010b6b5;
    slow_io_work_running = slow_io_work_running + 1;
    puVar1 = (slow_io_pending_wq.next)->next;
    (slow_io_pending_wq.next)->prev->next = puVar1;
    puVar1->prev = puVar4->prev;
    puVar4->next = puVar4;
    puVar4->prev = puVar4;
    if (slow_io_pending_wq.next != &slow_io_pending_wq) {
      run_slow_work_message.next = &wq;
      run_slow_work_message.prev = wq.prev;
      (wq.prev)->next = &run_slow_work_message;
      wq.prev = &run_slow_work_message;
      if (idle_threads != 0) {
        uv_cond_signal(&cond);
      }
    }
  }
  else {
    if (wq.next == &exit_message) {
      uv_cond_signal(&cond);
      uv_mutex_unlock(&mutex);
      return;
    }
    puVar4 = (wq.next)->next;
    (wq.next)->prev->next = puVar4;
    puVar4->prev = puVar3->prev;
    puVar3->next = puVar3;
    puVar3->prev = puVar3;
    puVar4 = puVar3;
  }
  uv_mutex_unlock(&mutex);
  (*(code *)puVar4[-2].prev)(&puVar4[-2].prev);
  uv_mutex_lock((uv_mutex_t *)&puVar4[-1].prev[10].prev);
  puVar4[-2].prev = (uv__queue *)0x0;
  puVar1 = puVar4[-1].prev;
  puVar4->next = (uv__queue *)&puVar1[9].prev;
  puVar2 = puVar1[10].next;
  puVar4->prev = puVar2;
  puVar2->next = puVar4;
  puVar1[10].next = puVar4;
  uv_async_send((uv_async_t *)(puVar4[-1].prev + 0xd));
  uv_mutex_unlock((uv_mutex_t *)&puVar4[-1].prev[10].prev);
  uv_mutex_lock(&mutex);
  if (puVar3 == &run_slow_work_message) {
    slow_io_work_running = slow_io_work_running - 1;
  }
  goto LAB_0010b6b5;
}

Assistant:

static void worker(void* arg) {
  struct uv__work* w;
  struct uv__queue* q;
  int is_slow_work;

  uv_sem_post((uv_sem_t*) arg);
  arg = NULL;

  uv_mutex_lock(&mutex);
  for (;;) {
    /* `mutex` should always be locked at this point. */

    /* Keep waiting while either no work is present or only slow I/O
       and we're at the threshold for that. */
    while (uv__queue_empty(&wq) ||
           (uv__queue_head(&wq) == &run_slow_work_message &&
            uv__queue_next(&run_slow_work_message) == &wq &&
            slow_io_work_running >= slow_work_thread_threshold())) {
      idle_threads += 1;
      uv_cond_wait(&cond, &mutex);
      idle_threads -= 1;
    }

    q = uv__queue_head(&wq);
    if (q == &exit_message) {
      uv_cond_signal(&cond);
      uv_mutex_unlock(&mutex);
      break;
    }

    uv__queue_remove(q);
    uv__queue_init(q);  /* Signal uv_cancel() that the work req is executing. */

    is_slow_work = 0;
    if (q == &run_slow_work_message) {
      /* If we're at the slow I/O threshold, re-schedule until after all
         other work in the queue is done. */
      if (slow_io_work_running >= slow_work_thread_threshold()) {
        uv__queue_insert_tail(&wq, q);
        continue;
      }

      /* If we encountered a request to run slow I/O work but there is none
         to run, that means it's cancelled => Start over. */
      if (uv__queue_empty(&slow_io_pending_wq))
        continue;

      is_slow_work = 1;
      slow_io_work_running++;

      q = uv__queue_head(&slow_io_pending_wq);
      uv__queue_remove(q);
      uv__queue_init(q);

      /* If there is more slow I/O work, schedule it to be run as well. */
      if (!uv__queue_empty(&slow_io_pending_wq)) {
        uv__queue_insert_tail(&wq, &run_slow_work_message);
        if (idle_threads > 0)
          uv_cond_signal(&cond);
      }
    }

    uv_mutex_unlock(&mutex);

    w = uv__queue_data(q, struct uv__work, wq);
    w->work(w);

    uv_mutex_lock(&w->loop->wq_mutex);
    w->work = NULL;  /* Signal uv_cancel() that the work req is done
                        executing. */
    uv__queue_insert_tail(&w->loop->wq, &w->wq);
    uv_async_send(&w->loop->wq_async);
    uv_mutex_unlock(&w->loop->wq_mutex);

    /* Lock `mutex` since that is expected at the start of the next
     * iteration. */
    uv_mutex_lock(&mutex);
    if (is_slow_work) {
      /* `slow_io_work_running` is protected by `mutex`. */
      slow_io_work_running--;
    }
  }
}